

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsvdir.c
# Opt level: O3

int main(int argc,char **argv)

{
  __time_t _Var1;
  int iVar2;
  int iVar3;
  ssize_t sVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  iopause_fd *x;
  char **ppcVar9;
  char ch;
  int wstat;
  taia now;
  taia stampcheck;
  taia deadline;
  stat s;
  char local_11d;
  int local_11c;
  long local_118;
  int local_10c;
  taia local_108;
  taia local_f0;
  taia local_d8;
  stat local_c0;
  
  ppcVar9 = argv + 1;
  progname = *argv;
  pcVar5 = argv[1];
  if (pcVar5 == (char *)0x0) {
    strerr_die(1,"usage: ",progname," [-P] dir","\n",(char *)0x0,(char *)0x0,(strerr *)0x0);
    pcVar5 = *ppcVar9;
  }
  if (*pcVar5 == '-') {
    if (pcVar5[1] != '-') {
      if (pcVar5[1] != 'P') goto LAB_00102ae0;
      pgrp = 1;
    }
    ppcVar9 = argv + 2;
    if (argv[2] == (char *)0x0) {
      strerr_die(1,"usage: ",progname," [-P] dir","\n",(char *)0x0,(char *)0x0,(strerr *)0x0);
    }
  }
LAB_00102ae0:
  sig_catch(sig_term,s_term);
  sig_catch(sig_hangup,s_hangup);
  svdir = *ppcVar9;
  if ((ppcVar9[1] != (char *)0x0) && (rplog = ppcVar9[1], iVar2 = setup_log(), iVar2 != 1)) {
    rplog = (char *)0x0;
    strerr_warn("runsvdir ",svdir,": warning: ","log service disabled.",(char *)0x0,(char *)0x0,
                (strerr *)0x0);
  }
  local_11c = open_read(".");
  if (local_11c == -1) {
    strerr_die(100,"runsvdir ",svdir,": fatal: ","unable to open current directory",(char *)0x0,": "
               ,&strerr_sys);
  }
  coe(local_11c);
  taia_now(&local_f0);
  local_118 = 0;
LAB_00102bf5:
  do {
    iVar2 = wait_nohang(&local_10c);
    if (0 < iVar2) {
      if (0 < (long)svnum) {
        lVar7 = 0;
        do {
          if (iVar2 == *(int *)((long)&sv[0].pid + lVar7)) {
            *(undefined4 *)((long)&sv[0].pid + lVar7) = 0;
            check = 1;
            break;
          }
          lVar7 = lVar7 + 0x18;
        } while ((long)svnum * 0x18 != lVar7);
      }
      goto LAB_00102bf5;
    }
    taia_now(&local_108);
    if (local_108.sec.x < local_f0.sec.x - 3) {
      strerr_warn("runsvdir ",svdir,": warning: ","time warp: resetting time stamp.",(char *)0x0,
                  (char *)0x0,(strerr *)0x0);
      taia_now(&local_f0);
      taia_now(&local_108);
      if (rplog != (char *)0x0) {
        taia_now(&stamplog);
      }
    }
    iVar2 = taia_less(&local_108,&local_f0);
    if (iVar2 == 0) {
      taia_uint(&local_d8,1);
      taia_add(&local_f0,&local_108,&local_d8);
      iVar2 = stat(svdir,&local_c0);
      _Var1 = local_c0.st_mtim.tv_sec;
      pcVar5 = "unable to stat ";
      if (iVar2 == -1) {
LAB_00102dc1:
        strerr_warn("runsvdir ",svdir,": warning: ",pcVar5,svdir,": ",&strerr_sys);
      }
      else if (((local_c0.st_mtim.tv_sec != local_118 || check != 0) || (local_c0.st_ino != ino)) ||
              (local_c0.st_dev != dev)) {
        iVar2 = chdir(svdir);
        pcVar5 = "unable to change directory to ";
        if (iVar2 == -1) goto LAB_00102dc1;
        dev = local_c0.st_dev;
        ino = local_c0.st_ino;
        check = 0;
        if (local_108.sec.x <= _Var1 + 0x400000000000000aU) {
          sleep(1);
        }
        runsvdir();
        iVar3 = fchdir(local_11c);
        iVar2 = local_11c;
        if (iVar3 == -1) {
          local_118 = _Var1;
          do {
            strerr_warn("runsvdir ",svdir,": warning: ","unable to change directory, pausing",
                        (char *)0x0,": ",&strerr_sys);
            sleep(5);
            iVar3 = fchdir(iVar2);
          } while (iVar3 == -1);
        }
        else {
          local_118 = _Var1;
        }
      }
    }
    if ((rplog != (char *)0x0) && (iVar2 = taia_less(&local_108,&stamplog), iVar2 == 0)) {
      write(logpipe[1],".",1);
      taia_uint(&local_d8,900);
      taia_add(&stamplog,&local_108,&local_d8);
    }
    taia_uint(&local_d8,(uint)(check == 0) * 4 + 1);
    taia_add(&local_d8,&local_108,&local_d8);
    sig_block(sig_child);
    if (rplog == (char *)0x0) {
      x = (iopause_fd *)0x0;
    }
    else {
      x = io;
    }
    iopause(x,(uint)(rplog != (char *)0x0),&local_d8,&local_108);
    sig_unblock(sig_child);
    if (rplog != (char *)0x0) {
      while (sVar4 = read(logpipe[0],&local_11d,1), 0 < sVar4) {
        if (local_11d != '\0') {
          lVar7 = (long)rploglen;
          if (6 < lVar7) {
            lVar6 = 6;
            do {
              rplog[lVar6 + -1] = rplog[lVar6];
              lVar6 = lVar6 + 1;
              lVar7 = (long)rploglen;
            } while (lVar6 < lVar7);
          }
          rplog[lVar7 + -1] = local_11d;
        }
      }
    }
    if (exitsoon == 1) {
      _exit(0);
    }
    if (exitsoon == 2) {
      if (0 < svnum) {
        piVar8 = &sv[0].pid;
        lVar7 = 0;
        iVar2 = svnum;
        do {
          if (*piVar8 != 0) {
            kill(*piVar8,0xf);
            iVar2 = svnum;
          }
          lVar7 = lVar7 + 1;
          piVar8 = piVar8 + 6;
        } while (lVar7 < iVar2);
      }
      _exit(0x6f);
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv) {
  struct stat s;
  time_t mtime =0;
  int wstat;
  int curdir;
  int pid;
  struct taia deadline;
  struct taia now;
  struct taia stampcheck;
  char ch;
  int i;

  progname =*argv++;
  if (! argv || ! *argv) usage();
  if (**argv == '-') {
    switch (*(*argv +1)) {
    case 'P': pgrp =1;
    case '-': ++argv;
    }
    if (! argv || ! *argv) usage();
  }

  sig_catch(sig_term, s_term);
  sig_catch(sig_hangup, s_hangup);
  svdir =*argv++;
  if (argv && *argv) {
    rplog =*argv;
    if (setup_log() != 1) {
      rplog =0;
      warn3x("log service disabled.", 0, 0);
    }
  }
  if ((curdir =open_read(".")) == -1)
    fatal("unable to open current directory", 0);
  coe(curdir);

  taia_now(&stampcheck);

  for (;;) {
    /* collect children */
    for (;;) {
      if ((pid =wait_nohang(&wstat)) <= 0) break;
      for (i =0; i < svnum; i++) {
        if (pid == sv[i].pid) {
          /* runsv has gone */
          sv[i].pid =0;
          check =1;
          break;
        }
      }
    }

    taia_now(&now);
    if (now.sec.x < (stampcheck.sec.x -3)) {
      /* time warp */
      warn3x("time warp: resetting time stamp.", 0, 0);
      taia_now(&stampcheck);
      taia_now(&now);
      if (rplog) taia_now(&stamplog);
    }
    if (taia_less(&now, &stampcheck) == 0) {
      /* wait at least a second */
      taia_uint(&deadline, 1);
      taia_add(&stampcheck, &now, &deadline);

      if (stat(svdir, &s) != -1) {
        if (check || \
            s.st_mtime != mtime || s.st_ino != ino || s.st_dev != dev) {
          /* svdir modified */
          if (chdir(svdir) != -1) {
            mtime =s.st_mtime;
            dev =s.st_dev;
            ino =s.st_ino;
            check =0;
            if (now.sec.x <= (4611686018427387914ULL +(uint64)mtime))
              sleep(1);
            runsvdir();
            while (fchdir(curdir) == -1) {
              warn("unable to change directory, pausing", 0);
              sleep(5);
            }
          }
          else
            warn("unable to change directory to ", svdir);
        }
      }
      else
        warn("unable to stat ", svdir);
    }

    if (rplog)
      if (taia_less(&now, &stamplog) == 0) {
        write(logpipe[1], ".", 1);
        taia_uint(&deadline, 900);
        taia_add(&stamplog, &now, &deadline);
      }
    taia_uint(&deadline, check ? 1 : 5);
    taia_add(&deadline, &now, &deadline);

    sig_block(sig_child);
    if (rplog)
      iopause(io, 1, &deadline, &now);
    else
      iopause(0, 0, &deadline, &now);
    sig_unblock(sig_child);

    if (rplog && (io[0].revents | IOPAUSE_READ))
      while (read(logpipe[0], &ch, 1) > 0)
        if (ch) {
          for (i =6; i < rploglen; i++)
            rplog[i -1] =rplog[i];
          rplog[rploglen -1] =ch;
        }

    switch(exitsoon) {
    case 1:
      _exit(0);
    case 2:
      for (i =0; i < svnum; i++) if (sv[i].pid) kill(sv[i].pid, SIGTERM);
      _exit(111);
    }
  }
  /* not reached */
  _exit(0);
}